

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::BitState<unsigned_char>,unsigned_char,duckdb::BitOrOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  uchar *idata_00;
  byte bVar1;
  UnifiedVectorFormat idata;
  SelectionVector *local_70;
  uchar *local_68;
  ValidityMask local_60;
  
  if (*input != (Vector)0x0) {
    if (*input == (Vector)0x2) {
      if ((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) {
        bVar1 = **(byte **)(input + 0x20);
        if (*state == '\0') {
          *state = '\x01';
        }
        else {
          bVar1 = bVar1 | state[1];
        }
        state[1] = bVar1;
      }
    }
    else {
      duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_70);
      duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
      UnaryUpdateLoop<duckdb::BitState<unsigned_char>,unsigned_char,duckdb::BitOrOperation>
                (local_68,aggr_input_data,(BitState<unsigned_char> *)state,count,&local_60,local_70)
      ;
      UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_70);
    }
    return;
  }
  idata_00 = *(uchar **)(input + 0x20);
  FlatVector::VerifyFlatVector(input);
  UnaryFlatUpdateLoop<duckdb::BitState<unsigned_char>,unsigned_char,duckdb::BitOrOperation>
            (idata_00,aggr_input_data,(BitState<unsigned_char> *)state,count,
             (ValidityMask *)(input + 0x28));
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}